

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void tests::disconnect_edge(void)

{
  NS *graph;
  N *this;
  N *this_00;
  N *this_01;
  N *this_02;
  N *this_03;
  N *this_04;
  ostream *poVar1;
  _Vector_base<N_*,_std::allocator<N_*>_> *this_05;
  initializer_list<N_*> ns;
  initializer_list<N_*> ns_00;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  _Vector_base<N_*,_std::allocator<N_*>_> local_68;
  Alg<void> local_50;
  
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this,"p");
  this_00 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_00,"q");
  this_01 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_01,"r");
  this_02 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_02,"x");
  this_03 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_03,"y");
  this_04 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_04,"z");
  viewed._M_t._M_impl._0_8_ = this_03;
  N::connect(this_02,(int)this,(sockaddr *)&viewed,1);
  viewed._M_t._M_impl._0_8_ = this_03;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_04;
  N::connect(this_02,(int)this_00,(sockaddr *)&viewed,2);
  viewed._M_t._M_impl._0_8_ = this_04;
  N::connect(this_02,(int)this_01,(sockaddr *)&viewed,1);
  ns._M_len = 2;
  ns._M_array = (iterator)&viewed;
  viewed._M_t._M_impl._0_8_ = this_03;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_04;
  N::disconnect(this_02,this_00,ns);
  ns_00._M_len = 1;
  ns_00._M_array = (iterator)&viewed;
  viewed._M_t._M_impl._0_8_ = this_04;
  N::disconnect(this_02,this_01,ns_00);
  viewed._M_t._M_impl._0_8_ = this_04;
  N::connect(this_02,(int)this_00,(sockaddr *)&viewed,1);
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &viewed._M_t._M_impl.super__Rb_tree_header._M_header;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  viewed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar1 = std::operator<<((ostream *)&std::cout,"digraph T {");
  std::endl<char,std::char_traits<char>>(poVar1);
  alg::dot((ostream *)&std::cout,&viewed);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  N::histo(this_02,&local_50,(vector<N_*,_std::allocator<N_*>_> *)&local_68);
  std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(&local_68);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_05 = (_Vector_base<N_*,_std::allocator<N_*>_> *)NS::clear(graph);
  if (this_05 != (_Vector_base<N_*,_std::allocator<N_*>_> *)0x0) {
    std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(this_05);
  }
  operator_delete(this_05,0x18);
  std::_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_>::~_Rb_tree
            (&viewed._M_t);
  return;
}

Assistant:

void disconnect_edge() {
        auto g = new NS();
        auto p = new(g) N("p"), q = new(g) N("q"), r = new(g) N("r");
        auto n1 = new(g) N("x"), n2 = new(g) N("y"), n3 = new(g) N("z");

        n1->connect(p, {n2});
        n1->connect(q, {n2, n3});
        n1->connect(r, {n3});

        n1->disconnect(q, {n2, n3});
        n1->disconnect(r, {n3});
        n1->connect(q, {n3});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }